

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.cpp
# Opt level: O0

JtagShiftedData * __thiscall
JtagShiftedData::GetHexOrBinaryString_abi_cxx11_
          (JtagShiftedData *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bits,
          DisplayBase display_base)

{
  bool bVar1;
  reference puVar2;
  ulong uVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  char local_c8 [2];
  char local_c6 [6];
  char number_str [128];
  size_t bit_cnt;
  size_t chunk_bits;
  size_t remain_bits;
  U64 val;
  const_iterator bsi;
  DisplayBase display_base_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bits_local;
  string *ret_val;
  
  bsi._M_current._3_1_ = 0;
  bsi._M_current._4_4_ = display_base;
  std::__cxx11::string::string((string *)this);
  val = (U64)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(bits);
  chunk_bits = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(bits);
  while( true ) {
    local_d0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bits);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&val,&local_d0);
    if (!bVar1) break;
    bit_cnt = chunk_bits & 0x3f;
    if (bit_cnt == 0) {
      bit_cnt = 0x40;
    }
    number_str[0x78] = (undefined1)bit_cnt;
    number_str[0x79] = bit_cnt._1_1_;
    number_str[0x7a] = bit_cnt._2_1_;
    number_str[0x7b] = bit_cnt._3_1_;
    number_str[0x7c] = bit_cnt._4_1_;
    number_str[0x7d] = bit_cnt._5_1_;
    number_str[0x7e] = bit_cnt._6_1_;
    number_str[0x7f] = bit_cnt._7_1_;
    remain_bits = 0;
    while( true ) {
      local_d8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bits);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&val,&local_d8);
      if (!bVar1 || number_str._120_8_ == 0) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&val);
      remain_bits = remain_bits << 1 | (long)(int)(uint)(*puVar2 == '\x01');
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&val);
      number_str._120_8_ = number_str._120_8_ + -1;
    }
    AnalyzerHelpers::GetNumberString(remain_bits,bsi._M_current._4_4_,(uint)bit_cnt,local_c8,0x80);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)this,local_c6);
    }
    else {
      std::__cxx11::string::operator=((string *)this,local_c8);
    }
    chunk_bits = chunk_bits - bit_cnt;
  }
  return this;
}

Assistant:

std::string JtagShiftedData::GetHexOrBinaryString( const std::vector<U8>& bits, DisplayBase display_base )
{
    std::string ret_val;
    std::vector<U8>::const_iterator bsi( bits.begin() );

    U64 val;
    size_t remain_bits = bits.size(), chunk_bits, bit_cnt;
    char number_str[ 128 ];
    while( bsi != bits.end() )
    {
        chunk_bits = remain_bits % 64;
        if( chunk_bits == 0 )
            chunk_bits = 64;

        // make a 64 bit value
        for( bit_cnt = chunk_bits, val = 0; bsi != bits.end() && bit_cnt > 0; ++bsi, --bit_cnt )
        {
            val = ( val << 1 ) | ( *bsi == BIT_HIGH ? 1 : 0 );
        }

        // make a string out of that value
        AnalyzerHelpers::GetNumberString( val, display_base, ( U32 )chunk_bits, number_str, sizeof( number_str ) );

        // concat the 64bit chunks but chop off all but the first 0x or 0b
        if( ret_val.empty() )
            ret_val = number_str;
        else
            ret_val += ( number_str + 2 );

        remain_bits -= chunk_bits;
    }

    return ret_val;
}